

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chset.hpp
# Opt level: O0

void __thiscall
boost::xpressive::detail::
compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>::
set_char(compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
         *this,char_type ch,regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr,
        bool icase)

{
  byte in_CL;
  undefined8 in_RDX;
  undefined1 in_SIL;
  undefined8 in_RDI;
  undefined7 in_stack_ffffffffffffffe0;
  undefined7 in_stack_fffffffffffffff0;
  
  if ((in_CL & 1) == 0) {
    basic_chset_8bit<char>::set
              ((basic_chset_8bit<char> *)
               (CONCAT17(in_CL,in_stack_ffffffffffffffe0) & 0x1ffffffffffffff),
               (char)((ulong)in_RDI >> 0x38));
  }
  else {
    basic_chset_8bit<char>::
    set<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              ((basic_chset_8bit<char> *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),
               (char)((ulong)in_RDX >> 0x38),
               (regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *)
               (CONCAT17(in_CL,in_stack_ffffffffffffffe0) & 0x1ffffffffffffff));
  }
  return;
}

Assistant:

void set_char(char_type ch, Traits const &tr, bool icase)
    {
        icase ? this->base_type::set(ch, tr) : this->base_type::set(ch);
    }